

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O2

void FAudio_INTERNAL_AllocEffectChain(FAudioVoice *voice,FAudioEffectChain *pEffectChain)

{
  uint uVar1;
  FAudioEffectDescriptor *pFVar2;
  void **ppvVar3;
  uint32_t *puVar4;
  uint8_t *puVar5;
  ulong uVar6;
  long lVar7;
  
  (voice->effects).state = FAPO_BUFFER_VALID;
  uVar1 = pEffectChain->EffectCount;
  (voice->effects).count = uVar1;
  if (uVar1 != 0) {
    lVar7 = 0;
    for (uVar6 = 0; uVar6 < uVar1; uVar6 = uVar6 + 1) {
      (*(code *)**(undefined8 **)((long)&pEffectChain->pEffectDescriptors->pEffect + lVar7))();
      uVar1 = pEffectChain->EffectCount;
      lVar7 = lVar7 + 0x10;
    }
    pFVar2 = (FAudioEffectDescriptor *)(*voice->audio->pMalloc)((ulong)(voice->effects).count << 4);
    (voice->effects).desc = pFVar2;
    SDL_memcpy(pFVar2,pEffectChain->pEffectDescriptors,(ulong)(voice->effects).count << 4);
    ppvVar3 = (void **)(*voice->audio->pMalloc)((ulong)(voice->effects).count << 3);
    (voice->effects).parameters = ppvVar3;
    SDL_memset(ppvVar3,0,(ulong)(voice->effects).count << 3);
    puVar4 = (uint32_t *)(*voice->audio->pMalloc)((ulong)(voice->effects).count << 2);
    (voice->effects).parameterSizes = puVar4;
    SDL_memset(puVar4,0,(ulong)(voice->effects).count << 2);
    puVar5 = (uint8_t *)(*voice->audio->pMalloc)((size_t)(voice->effects).count);
    (voice->effects).parameterUpdates = puVar5;
    SDL_memset(puVar5,0,(voice->effects).count);
    puVar5 = (uint8_t *)(*voice->audio->pMalloc)((size_t)(voice->effects).count);
    (voice->effects).inPlaceProcessing = puVar5;
    SDL_memset(puVar5,0,(voice->effects).count);
    return;
  }
  return;
}

Assistant:

void FAudio_INTERNAL_AllocEffectChain(
	FAudioVoice *voice,
	const FAudioEffectChain *pEffectChain
) {
	uint32_t i;

	LOG_FUNC_ENTER(voice->audio)
	voice->effects.state = FAPO_BUFFER_VALID;
	voice->effects.count = pEffectChain->EffectCount;
	if (voice->effects.count == 0)
	{
		LOG_FUNC_EXIT(voice->audio)
		return;
	}

	for (i = 0; i < pEffectChain->EffectCount; i += 1)
	{
		pEffectChain->pEffectDescriptors[i].pEffect->AddRef(pEffectChain->pEffectDescriptors[i].pEffect);
	}

	voice->effects.desc = (FAudioEffectDescriptor*) voice->audio->pMalloc(
		voice->effects.count * sizeof(FAudioEffectDescriptor)
	);
	FAudio_memcpy(
		voice->effects.desc,
		pEffectChain->pEffectDescriptors,
		voice->effects.count * sizeof(FAudioEffectDescriptor)
	);
	#define ALLOC_EFFECT_PROPERTY(prop, type) \
		voice->effects.prop = (type*) voice->audio->pMalloc( \
			voice->effects.count * sizeof(type) \
		); \
		FAudio_zero( \
			voice->effects.prop, \
			voice->effects.count * sizeof(type) \
		);
	ALLOC_EFFECT_PROPERTY(parameters, void*)
	ALLOC_EFFECT_PROPERTY(parameterSizes, uint32_t)
	ALLOC_EFFECT_PROPERTY(parameterUpdates, uint8_t)
	ALLOC_EFFECT_PROPERTY(inPlaceProcessing, uint8_t)
	#undef ALLOC_EFFECT_PROPERTY
	LOG_FUNC_EXIT(voice->audio)
}